

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_8_fcbf97e8_for_proto *pp;
  byte *pbVar1;
  ushort *puVar2;
  connectdata *pcVar3;
  IMAP *pIVar4;
  curl_trc_feat *pcVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  dynbuf *s;
  _Bool _Var9;
  unsigned_short uVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  char *maxlen;
  size_t sVar16;
  byte *pbVar17;
  int imapcode;
  char *ptr;
  size_t nread;
  ulong local_78;
  uint local_6c;
  dynbuf local_68;
  dynbuf *local_48;
  SASL *local_40;
  size_t local_38;
  
  pp = &conn->proto;
  local_38 = 0;
  local_48 = (dynbuf *)((long)&conn->proto + 0x58);
  local_40 = &(conn->proto).imapc.sasl;
LAB_00140306:
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) goto LAB_00140375;
  local_68.bufr = (char *)((ulong)local_68.bufr & 0xffffffffffffff00);
  _Var9 = Curl_conn_is_ssl(conn,0);
  if (_Var9) {
LAB_00140342:
    CVar11 = Curl_conn_connect(data,0,false,(_Bool *)&local_68);
    if (CVar11 == CURLE_OK) {
      CVar11 = CURLE_OK;
      if ((char)local_68.bufr == '\x01') {
        *(undefined2 *)((long)&conn->proto + 0xb8) = 0;
        *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
        *(byte *)((long)&conn->proto + 0xfb) = *(byte *)((long)&conn->proto + 0xfb) & 0xfb | 1;
        CVar11 = imap_sendf(data,"CAPABILITY");
        if (CVar11 == CURLE_OK) {
          (data->conn->proto).imapc.state = IMAP_CAPABILITY;
        }
      }
    }
  }
  else {
    CVar11 = Curl_ssl_cfilter_add(data,conn,0);
    if (CVar11 == CURLE_OK) {
      conn->handler = &Curl_handler_imaps;
      goto LAB_00140342;
    }
  }
  if ((CVar11 != CURLE_OK) || ((conn->proto).imapc.state == IMAP_UPGRADETLS)) {
    return CVar11;
  }
LAB_00140375:
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar11 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar11;
  }
  do {
    CVar11 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,(int *)&local_6c,&local_38);
    uVar8 = local_6c;
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    if (local_6c == 0xffffffff) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_6c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pcVar3 = data->conn;
      if (local_6c != 1) {
        if (local_6c != 3) {
          Curl_failf(data,"Got unexpected imap-server response");
          CVar11 = CURLE_WEIRD_SERVER_REPLY;
          break;
        }
        pbVar17 = (byte *)((long)&pcVar3->proto + 0xfb);
        *pbVar17 = *pbVar17 | 2;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"PREAUTH connection, already authenticated");
        }
      }
      *(undefined2 *)((long)&pcVar3->proto + 0xb8) = 0;
      *(undefined2 *)((long)&pcVar3->proto + 0xbc) = 0;
      pbVar17 = (byte *)((long)&pcVar3->proto + 0xfb);
      *pbVar17 = *pbVar17 & 0xfb;
      CVar11 = imap_sendf(data,"CAPABILITY");
      if (CVar11 == CURLE_OK) {
        (data->conn->proto).imapc.state = IMAP_CAPABILITY;
      }
      break;
    case IMAP_CAPABILITY:
      pcVar3 = data->conn;
      pcVar14 = Curl_dyn_ptr(&(pcVar3->proto).ftpc.pp.recvbuf);
      if (uVar8 == 0x2a) {
        pbVar17 = (byte *)(pcVar14 + 2);
LAB_00140576:
        do {
          uVar15 = (ulong)*pbVar17;
          if (uVar15 < 0x21) {
            if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
              pbVar17 = pbVar17 + 1;
              goto LAB_00140576;
            }
            if (uVar15 != 0) goto LAB_00140598;
            bVar7 = false;
          }
          else {
LAB_00140598:
            pcVar14 = (char *)0x0;
            while ((0x20 < (ulong)pbVar17[(long)pcVar14] ||
                   ((0x100002601U >> ((ulong)pbVar17[(long)pcVar14] & 0x3f) & 1) == 0))) {
              pcVar14 = pcVar14 + 1;
            }
            if (pcVar14 == (char *)0x7) {
              if (*(int *)(pbVar17 + 3) != 0x52492d4c || *(int *)pbVar17 != 0x4c534153)
              goto LAB_0014062e;
              pbVar1 = (byte *)((long)&pcVar3->proto + 0xfb);
              *pbVar1 = *pbVar1 | 0x10;
              maxlen = (char *)0x7;
            }
            else if (pcVar14 == (char *)0xd) {
              if (*(long *)(pbVar17 + 5) != 0x44454c4241534944 ||
                  *(long *)pbVar17 != 0x5349444e49474f4c) goto LAB_0014062e;
              pbVar1 = (byte *)((long)&pcVar3->proto + 0xfb);
              *pbVar1 = *pbVar1 | 8;
              maxlen = (char *)0xd;
            }
            else if ((pcVar14 == (char *)0x8) && (*(long *)pbVar17 == 0x534c545452415453)) {
              pbVar1 = (byte *)((long)&pcVar3->proto + 0xfb);
              *pbVar1 = *pbVar1 | 4;
              maxlen = (char *)0x8;
            }
            else {
LAB_0014062e:
              maxlen = pcVar14;
              if (((char *)0x5 < pcVar14) && (pbVar17[4] == 0x3d && *(int *)pbVar17 == 0x48545541))
              {
                pbVar17 = pbVar17 + 5;
                maxlen = pcVar14 + -5;
                uVar10 = Curl_sasl_decode_mech((char *)pbVar17,(size_t)maxlen,(size_t *)&local_68);
                if ((uVar10 != 0) && (local_68.bufr + 5 == pcVar14)) {
                  puVar2 = (ushort *)((long)&pcVar3->proto + 0xb8);
                  *puVar2 = *puVar2 | uVar10;
                }
              }
            }
            pbVar17 = pbVar17 + (long)maxlen;
            bVar7 = true;
          }
        } while (bVar7);
        CVar11 = CURLE_OK;
      }
      else if (((data->set).use_ssl == '\0') || (_Var9 = Curl_conn_is_ssl(pcVar3,0), _Var9)) {
LAB_00140a5d:
        CVar11 = imap_perform_authentication(data,pcVar3);
      }
      else if ((uVar8 == 1) && ((*(byte *)((long)&pcVar3->proto + 0xfb) & 6) == 4)) {
        CVar11 = imap_sendf(data,"STARTTLS");
        if (CVar11 == CURLE_OK) {
          (data->conn->proto).imapc.state = IMAP_STARTTLS;
        }
      }
      else {
        if ((data->set).use_ssl < 2) goto LAB_00140a5d;
        Curl_failf(data,"STARTTLS not available.");
        CVar11 = CURLE_USE_SSL_FAILED;
      }
      break;
    case IMAP_STARTTLS:
      pcVar3 = data->conn;
      CVar11 = CURLE_WEIRD_SERVER_REPLY;
      if ((pcVar3->proto).ftpc.pp.overflow == 0) {
        if (local_6c == 1) {
          (pcVar3->proto).imapc.state = IMAP_UPGRADETLS;
          CVar11 = CURLE_OK;
        }
        else if ((data->set).use_ssl == '\x01') {
          CVar11 = imap_perform_authentication(data,pcVar3);
        }
        else {
          Curl_failf(data,"STARTTLS denied");
          CVar11 = CURLE_USE_SSL_FAILED;
        }
      }
      if ((CVar11 == CURLE_OK) && (CVar11 = CURLE_OK, (conn->proto).imapc.state == IMAP_UPGRADETLS))
      goto LAB_00140306;
      break;
    default:
      goto switchD_001403d7_caseD_4;
    case IMAP_AUTHENTICATE:
      CVar11 = Curl_sasl_continue(local_40,data,local_6c,(saslprogress *)&local_68);
      if (CVar11 == CURLE_OK) {
        if ((int)local_68.bufr == 0) {
          if (((*(byte *)((long)&conn->proto + 0xfb) & 8) == 0) &&
             (((conn->proto).imapc.preftype & 1) != 0)) {
            CVar11 = imap_perform_login(data,conn);
          }
          else {
            Curl_failf(data,"Authentication cancelled");
            CVar11 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar11 = CURLE_OK;
          CVar12 = CURLE_OK;
          if ((int)local_68.bufr == 2) goto LAB_00140958;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_6c == 1) goto switchD_001403d7_caseD_4;
      Curl_failf(data,"Access denied. %c",(ulong)local_6c);
      CVar11 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      pcVar14 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (uVar8 == 1) goto switchD_001403d7_caseD_4;
      CVar11 = CURLE_QUOTE_ERROR;
      if (uVar8 == 0x2a) {
        CVar11 = Curl_client_write(data,1,pcVar14,(data->conn->proto).ftpc.pp.nfinal);
      }
      break;
    case IMAP_SELECT:
      pcVar3 = data->conn;
      pIVar4 = (data->req).p.imap;
      pcVar14 = Curl_dyn_ptr(&(pcVar3->proto).ftpc.pp.recvbuf);
      if (uVar8 == 1) {
        if (((pIVar4->uidvalidity == (char *)0x0) ||
            (pcVar14 = (pcVar3->proto).ftpc.server_os, pcVar14 == (char *)0x0)) ||
           (iVar13 = curl_strequal(pIVar4->uidvalidity,pcVar14), iVar13 != 0)) {
          pcVar14 = (*Curl_cstrdup)(pIVar4->mailbox);
          (pcVar3->proto).imapc.mailbox = pcVar14;
          if (pcVar14 == (char *)0x0) {
            CVar11 = CURLE_OUT_OF_MEMORY;
          }
          else if (pIVar4->custom == (char *)0x0) {
            if (pIVar4->query == (char *)0x0) {
              CVar11 = imap_perform_fetch(data);
            }
            else {
              CVar11 = imap_perform_search(data);
            }
          }
          else {
            CVar11 = imap_perform_list(data);
          }
        }
        else {
          Curl_failf(data,"Mailbox UIDVALIDITY has changed");
          CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else if (uVar8 == 0x2a) {
        iVar13 = curl_strnequal(pcVar14 + 2,"OK [UIDVALIDITY ",0x10);
        CVar11 = CURLE_OK;
        if (iVar13 != 0) {
          pcVar14 = pcVar14 + 0x12;
          sVar16 = 0;
          do {
            if (9 < (byte)(pcVar14[sVar16] - 0x30U)) goto LAB_0014075e;
            sVar16 = sVar16 + 1;
          } while (sVar16 != 0x14);
          sVar16 = 0x14;
LAB_0014075e:
          if ((sVar16 != 0) && (pcVar14[sVar16] == ']')) {
            Curl_dyn_init(&local_68,0x14);
            CVar12 = Curl_dyn_addn(&local_68,pcVar14,sVar16);
            if (CVar12 == CURLE_OK) {
              (*Curl_cfree)((pcVar3->proto).ftpc.server_os);
              pcVar14 = Curl_dyn_ptr(&local_68);
              (pcVar3->proto).ftpc.server_os = pcVar14;
            }
            else {
              CVar11 = CURLE_OUT_OF_MEMORY;
            }
          }
        }
      }
      else {
        Curl_failf(data,"Select failed");
        CVar11 = CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_FETCH:
      local_68.bufr = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      local_78 = 0;
      if (uVar8 == 0x2a) {
        local_68.bufr = (char *)memchr(local_68.bufr,0x7b,(data->conn->proto).ftpc.pp.nfinal);
        if (local_68.bufr != (char *)0x0) {
          local_68.bufr = local_68.bufr + 1;
          iVar13 = Curl_str_number(&local_68.bufr,(curl_off_t *)&local_78,0x7fffffffffffffff);
          if ((iVar13 == 0) && (iVar13 = Curl_str_single(&local_68.bufr,'}'), iVar13 == 0)) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                (0 < pcVar5->log_level)))) {
              Curl_infof(data,"Found %ld bytes to download",local_78);
            }
            Curl_pgrsSetDownloadSize(data,local_78);
            s = local_48;
            uVar15 = (conn->proto).ftpc.pp.overflow;
            if (uVar15 == 0) {
              CVar11 = CURLE_OK;
            }
            else {
              Curl_dyn_tail(local_48,uVar15);
              (conn->proto).ftpc.pp.nfinal = 0;
              if (local_78 <= uVar15) {
                uVar15 = local_78;
              }
              if (local_78 == 0) {
                (data->conn->proto).imapc.state = IMAP_STOP;
                CVar11 = CURLE_OK;
LAB_00140c52:
                bVar7 = false;
              }
              else {
                pcVar14 = Curl_dyn_ptr(s);
                CVar11 = Curl_client_write(data,1,pcVar14,uVar15);
                if (CVar11 != CURLE_OK) goto LAB_00140c52;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                   ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar5->log_level)))) {
                  Curl_infof(data,"Written %zu bytes, %lu bytes are left for transfer",uVar15);
                }
                uVar6 = (conn->proto).ftpc.pp.overflow;
                sVar16 = uVar6 - uVar15;
                if (uVar6 < uVar15 || sVar16 == 0) {
                  (conn->proto).ftpc.pp.overflow = 0;
                  Curl_dyn_reset(local_48);
                }
                else {
                  (conn->proto).ftpc.pp.overflow = sVar16;
                  Curl_dyn_tail(local_48,sVar16);
                }
                bVar7 = true;
                CVar11 = CURLE_OK;
              }
              if (!bVar7) break;
            }
            if ((data->req).bytecount != local_78) {
              (data->req).maxdownload = local_78;
              (data->state).select_bits = '\x01';
              iVar13 = 1;
              uVar15 = local_78;
              goto LAB_00140455;
            }
            Curl_xfer_setup_nop(data);
            CVar12 = CVar11;
            goto LAB_00140958;
          }
        }
        Curl_failf(data,"Failed to parse FETCH response.");
        CVar12 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(data,-1);
        CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00140958:
      CVar11 = CVar12;
      (data->conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      CVar11 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_0014080e;
    case IMAP_APPEND:
      CVar11 = CURLE_UPLOAD_FAILED;
      if (local_6c == 0x2b) {
        Curl_pgrsSetUploadSize(data,(data->state).infilesize);
        CVar11 = CURLE_OK;
        iVar13 = 2;
        uVar15 = 0xffffffffffffffff;
LAB_00140455:
        Curl_xfer_setup1(data,iVar13,uVar15,false);
        CVar12 = CVar11;
        goto LAB_00140958;
      }
      break;
    case IMAP_APPEND_FINAL:
      CVar11 = CURLE_UPLOAD_FAILED;
LAB_0014080e:
      if (local_6c == 1) {
switchD_001403d7_caseD_4:
        (data->conn->proto).imapc.state = IMAP_STOP;
        CVar11 = CURLE_OK;
      }
    }
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var9 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var9) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
upgrade_tls:
  if(imapc->state == IMAP_UPGRADETLS) {
    result = imap_perform_upgrade_tls(data, conn);
    if(result || (imapc->state == IMAP_UPGRADETLS))
      return result;
  }

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (imapc->state == IMAP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}